

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintDouble
          (FieldValuePrinterWrapper *this,double val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_50 [32];
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  double val_local;
  FieldValuePrinterWrapper *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (double)this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[8])(generator_local);
  local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
  TextFormat::BaseTextGenerator::PrintString(generator,local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void PrintDouble(double val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintDouble(val));
  }